

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<anurbs::Line<2L>,_std::shared_ptr<anurbs::Line<2L>_>_> * __thiscall
pybind11::class_<anurbs::Line<2l>,std::shared_ptr<anurbs::Line<2l>>>::
def_static<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>(*)(Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,bool),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
          (class_<anurbs::Line<2l>,std::shared_ptr<anurbs::Line<2l>>> *this,char *name_,
          _func_pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_bool
          **f,arg *extra,arg *extra_1,arg *extra_2,arg_v *extra_3)

{
  _func_pair<double,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_Matrix<double,_1,_2,_1,_1,_2>_ptr_bool
  *f_00;
  handle obj;
  handle key;
  handle local_78;
  handle local_70;
  cpp_function cf;
  object local_60;
  object local_58;
  name local_50;
  PyObject *local_48;
  object local_40;
  object local_38;
  
  f_00 = *f;
  local_58.super_handle.m_ptr = *(handle *)this;
  local_60.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_50.value = name_;
  local_78.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_78.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_78.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_70.m_ptr = local_78.m_ptr;
  cpp_function::
  cpp_function<std::pair<double,Eigen::Matrix<double,1,2,1,1,2>>,Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,Eigen::Matrix<double,1,2,1,1,2>const&,bool,pybind11::name,pybind11::scope,pybind11::sibling,pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg_v>
            (&cf,f_00,&local_50,(scope *)&local_58,(sibling *)&local_70,extra,extra_1,extra_2,
             extra_3);
  object::~object((object *)&local_78);
  object::~object(&local_60);
  staticmethod::staticmethod((staticmethod *)&local_70,(object *)&cf);
  cpp_function::name((cpp_function *)&local_78);
  key.m_ptr = local_78.m_ptr;
  obj.m_ptr = *(PyObject **)this;
  if (local_78.m_ptr != (PyObject *)0x0) {
    (local_78.m_ptr)->ob_refcnt = (local_78.m_ptr)->ob_refcnt + 1;
  }
  local_40.super_handle.m_ptr = (handle)(handle)local_78.m_ptr;
  local_58.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_48 = obj.m_ptr;
  object::~object(&local_58);
  detail::accessor_policies::obj_attr::set(obj,key,local_70);
  object::~object(&local_38);
  object::~object(&local_40);
  object::~object((object *)&local_78);
  object::~object((object *)&local_70);
  object::~object((object *)&cf);
  return (class_<anurbs::Line<2L>,_std::shared_ptr<anurbs::Line<2L>_>_> *)this;
}

Assistant:

class_ &
    def_static(const char *name_, Func &&f, const Extra&... extra) {
        static_assert(!std::is_member_function_pointer<Func>::value,
                "def_static(...) called with a non-static member function pointer");
        cpp_function cf(std::forward<Func>(f), name(name_), scope(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = staticmethod(cf);
        return *this;
    }